

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

Stmt * __thiscall sqlite::Connection::Stmt::operator=(Stmt *this,Stmt *other)

{
  Stmt *in_RSI;
  Stmt *in_RDI;
  
  if (in_RSI != in_RDI) {
    sqlite3_finalize(in_RDI->stmt_);
    in_RDI->stmt_ = in_RSI->stmt_;
    in_RDI->db_ = in_RSI->db_;
    in_RSI->stmt_ = (sqlite3_stmt *)0x0;
  }
  return in_RDI;
}

Assistant:

Connection::Stmt & Connection::Stmt::operator=(Connection::Stmt && other)
    {
        if(&other != this)
        {
            sqlite3_finalize(stmt_);
            stmt_ = other.stmt_;
            db_ = other.db_;
            other.stmt_ = nullptr;
        }
        return *this;
    }